

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

PegoutKeyData *
cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
          (PegoutKeyData *__return_storage_ptr__,Pubkey *online_pubkey,Privkey *master_online_key,
          string *bitcoin_descriptor,uint32_t bip32_counter,ByteData *whitelist,NetType net_type,
          ByteData *pubkey_prefix,NetType elements_net_type,Address *descriptor_derive_address)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_t sVar5;
  ulong uVar6;
  reference pvVar7;
  ByteData *in_stack_fffffffffffff898;
  ExtPubkey *base_ext_pubkey;
  undefined4 uVar9;
  ByteData *pBVar8;
  ByteData *in_stack_fffffffffffff8a0;
  string *in_stack_fffffffffffff8b0;
  Pubkey *this;
  undefined8 in_stack_fffffffffffff8b8;
  CfdError CVar10;
  CfdException *in_stack_fffffffffffff8c0;
  CfdException *this_00;
  byte local_682;
  ByteData local_650;
  Pubkey local_638;
  ByteData local_620;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_608;
  ByteData256 local_5f0;
  undefined1 local_5d8 [8];
  ByteData whitelist_proof;
  undefined1 local_5a8 [8];
  ByteData btcpubkeybytes;
  ByteData256 tweak_sum;
  string local_570 [32];
  CfdSourceLocation local_550;
  ByteData local_538;
  undefined1 local_520 [8];
  ByteData offline_pubkey_negate;
  Pubkey offline_pubkey;
  string local_4e8 [32];
  CfdSourceLocation local_4c8;
  uint local_4ac;
  undefined1 local_4a8 [4];
  uint32_t index_1;
  ByteData *local_490;
  ByteData *online_pubkey_bytes;
  undefined1 local_480 [3];
  bool is_find;
  uint32_t whitelist_index;
  ExtPubkey child_xpub;
  ExtPubkey xpub;
  string local_398 [39];
  allocator local_371;
  string local_370;
  ByteData local_350;
  allocator local_331;
  string local_330;
  ByteData local_310;
  undefined1 local_2f8 [8];
  ByteData prefix;
  CfdException *except;
  allocator_type local_251;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  ByteData local_228;
  undefined1 local_210 [8];
  Pubkey online_key;
  allocator_type local_1d9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  ByteData local_1b0;
  undefined1 local_198 [8];
  Pubkey offline_key;
  uint32_t online_key_end;
  uint32_t online_key_start;
  uint32_t offline_key_end;
  uint32_t offline_key_start;
  uint32_t index;
  uint local_144;
  iterator iStack_140;
  uint32_t whitelist_count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  const_iterator ite;
  string local_128 [39];
  byte local_101;
  Pubkey local_100;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  uint local_98;
  uint32_t whitelist_size;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> whitelist_bytes;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> online_keys;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> offline_keys;
  ByteData *whitelist_local;
  uint32_t bip32_counter_local;
  string *bitcoin_descriptor_local;
  Privkey *master_online_key_local;
  Pubkey *online_pubkey_local;
  PegoutKeyData *result;
  
  PegoutKeyData::PegoutKeyData(__return_storage_ptr__);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &online_keys.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,whitelist);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  local_98 = (uint)sVar3;
  if ((local_98 == 0) || ((int)((sVar3 & 0xffffffff) % 0x42) != 0)) {
    local_ba = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"whitelist length error.",&local_b9);
    CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
    local_ba = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (1000000000 < bip32_counter) {
    local_e2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e0,"bip32_counter over error.",&local_e1);
    CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
    local_e2 = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_101 = 0;
  bVar2 = Pubkey::IsValid(online_pubkey);
  local_682 = 1;
  if (bVar2) {
    bVar2 = Privkey::IsValid(master_online_key);
    local_682 = 1;
    if (bVar2) {
      Privkey::GeneratePubkey(&local_100,master_online_key,true);
      local_101 = 1;
      bVar2 = Pubkey::Equals(&local_100,online_pubkey);
      local_682 = bVar2 ^ 0xff;
    }
  }
  if ((local_101 & 1) != 0) {
    Pubkey::~Pubkey((Pubkey *)0x4bc5cc);
  }
  CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  if ((local_682 & 1) != 0) {
    ite._M_current._6_1_ = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_128,"Illegal online key error.",(allocator *)((long)&ite._M_current + 7));
    CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
    ite._M_current._6_1_ = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iStack_140 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         (&in_stack_fffffffffffff898->data_);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_138,&stack0xfffffffffffffec0);
  CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  local_144 = local_98 / 0x42;
  if (0x100 < local_144) {
    offline_key_start._2_1_ = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&index,"Illegal whitelist maximum error.",
               (allocator *)((long)&offline_key_start + 3));
    CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
    offline_key_start._2_1_ = 0;
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  for (offline_key_end = 0; offline_key_end < local_144; offline_key_end = offline_key_end + 1) {
    uVar1 = offline_key_end * 0x42;
    offline_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar1 + 0x21;
    offline_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = offline_key_end * 0x42 + 0x42;
    local_1d0 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,(ulong)uVar1);
    local_1d8 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,(ulong)(uVar1 + 0x21));
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4bc8e3);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c8,local_1d0,local_1d8
               ,&local_1d9);
    ByteData::ByteData(&local_1b0,&local_1c8);
    Pubkey::Pubkey((Pubkey *)local_198,&local_1b0);
    ByteData::~ByteData((ByteData *)0x4bc93c);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff8b0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4bc954);
    Pubkey::GetData((ByteData *)
                    &online_key.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_198);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &online_keys.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &online_key.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)0x4bc987);
    local_248 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,
                            (ulong)offline_key.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_250 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,
                            (ulong)(uint)offline_key.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4bc9d7);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,local_248,local_250
               ,&local_251);
    ByteData::ByteData(&local_228,&local_240);
    Pubkey::Pubkey((Pubkey *)local_210,&local_228);
    ByteData::~ByteData((ByteData *)0x4bca30);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff8b0);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4bca48);
    Pubkey::GetData((ByteData *)&except,(Pubkey *)local_210);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&except);
    ByteData::~ByteData((ByteData *)0x4bca7b);
    Pubkey::~Pubkey((Pubkey *)0x4bca87);
    Pubkey::~Pubkey((Pubkey *)0x4bca93);
  }
  ByteData::ByteData(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  if ((net_type == kTestnet) || (net_type == kRegtest)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_330,"043587cf",&local_331);
    ByteData::ByteData(&local_310,&local_330);
    ByteData::operator=(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    ByteData::~ByteData((ByteData *)0x4bce15);
    ::std::__cxx11::string::~string((string *)&local_330);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_331);
  }
  else if (net_type == kMainnet) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_370,"0488b21e",&local_371);
    ByteData::ByteData(&local_350,&local_370);
    ByteData::operator=(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    ByteData::~ByteData((ByteData *)0x4bcee2);
    ::std::__cxx11::string::~string((string *)&local_370);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
  }
  else {
    sVar5 = ByteData::GetDataSize((ByteData *)local_2f8);
    CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
    if (sVar5 != 4) {
      xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_398,"Illegal prefix and nettype.",
                 (allocator *)
                 ((long)&xpub.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
      xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ExtPubkey::ExtPubkey
            ((ExtPubkey *)
             &child_xpub.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  base_ext_pubkey =
       (ExtPubkey *)
       &child_xpub.tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  GenerateExtPubkeyFromDescriptor
            ((ExtPubkey *)local_480,bitcoin_descriptor,bip32_counter,(ByteData *)local_2f8,net_type,
             elements_net_type,base_ext_pubkey,descriptor_derive_address);
  online_pubkey_bytes._4_4_ = 0;
  online_pubkey_bytes._3_1_ = 0;
  Pubkey::GetData((ByteData *)local_4a8,online_pubkey);
  local_490 = (ByteData *)local_4a8;
  local_4ac = 0;
  do {
    uVar6 = (ulong)local_4ac;
    sVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                       &whitelist_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pBVar8 = local_490;
    uVar9 = (undefined4)((ulong)base_ext_pubkey >> 0x20);
    CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
    if (sVar3 <= uVar6) {
LAB_004bd1c1:
      if ((online_pubkey_bytes._3_1_ & 1) == 0) {
        local_4c8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_4c8.filename = local_4c8.filename + 1;
        local_4c8.line = 0xc8c;
        local_4c8.funcname = "GetPegoutPubkeyData";
        logger::warn<>(&local_4c8,"online_pubkey not exists.");
        offline_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4e8,"online_pubkey not exists.",
                   (allocator *)
                   ((long)&offline_pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(in_stack_fffffffffffff8c0,CVar10,in_stack_fffffffffffff8b0);
        offline_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::GetPubkey
                ((Pubkey *)
                 &offline_pubkey_negate.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ExtPubkey *)
                 &child_xpub.tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      Pubkey::GetData(&local_538,
                      (Pubkey *)
                      &offline_pubkey_negate.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      WallyUtil::NegatePubkey((ByteData *)local_520,&local_538);
      ByteData::~ByteData((ByteData *)0x4bd342);
      pvVar7 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &online_keys.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)online_pubkey_bytes._4_4_);
      bVar2 = ByteData::Equals(pvVar7,(ByteData *)local_520);
      if (!bVar2) {
        local_550.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_550.filename = local_550.filename + 1;
        local_550.line = 0xc94;
        local_550.funcname = "GetPegoutPubkeyData";
        logger::warn<>(&local_550,"offline_pubkey not exists.");
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        this_00 = (CfdException *)
                  ((long)&tweak_sum.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_570,"offline_pubkey not exists.",(allocator *)this_00);
        CfdException::CfdException
                  (this_00,(CfdError)((ulong)uVar4 >> 0x20),in_stack_fffffffffffff8b0);
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::GetPubTweakSum
                ((ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ExtPubkey *)local_480);
      Pubkey::GetData((ByteData *)
                      &whitelist_proof.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (Pubkey *)
                      &offline_pubkey_negate.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      WallyUtil::AddTweakPubkey
                ((ByteData *)local_5a8,
                 (ByteData *)
                 &whitelist_proof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,false);
      ByteData::~ByteData((ByteData *)0x4bd548);
      Privkey::GetData(&local_620,master_online_key);
      ByteData::GetBytes(&local_608,&local_620);
      ByteData256::ByteData256(&local_5f0,&local_608);
      pBVar8 = (ByteData *)CONCAT44(uVar9,online_pubkey_bytes._4_4_);
      WallyUtil::SignWhitelist
                ((ByteData *)local_5d8,(ByteData *)local_5a8,&local_5f0,
                 (ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &online_keys.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,online_pubkey_bytes._4_4_);
      ByteData256::~ByteData256((ByteData256 *)0x4bd5c6);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff8b0)
      ;
      ByteData::~ByteData((ByteData *)0x4bd5de);
      ByteData::ByteData((ByteData *)descriptor_derive_address,pBVar8);
      Pubkey::Pubkey(&local_638,&local_650);
      this = &local_638;
      Pubkey::operator=(&__return_storage_ptr__->btc_pubkey_bytes,this);
      Pubkey::~Pubkey((Pubkey *)0x4bd62e);
      ByteData::~ByteData((ByteData *)0x4bd63a);
      ByteData::operator=((ByteData *)descriptor_derive_address,pBVar8);
      ByteData::~ByteData((ByteData *)0x4bd663);
      ByteData::~ByteData((ByteData *)0x4bd66f);
      ByteData256::~ByteData256((ByteData256 *)0x4bd67b);
      ByteData::~ByteData((ByteData *)0x4bd687);
      Pubkey::~Pubkey((Pubkey *)0x4bd693);
      ByteData::~ByteData((ByteData *)0x4bd69f);
      ExtPubkey::~ExtPubkey((ExtPubkey *)descriptor_derive_address);
      ExtPubkey::~ExtPubkey((ExtPubkey *)descriptor_derive_address);
      ByteData::~ByteData((ByteData *)0x4bd6c3);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this);
      return __return_storage_ptr__;
    }
    pvVar7 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &whitelist_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_4ac);
    bVar2 = ByteData::Equals(pBVar8,pvVar7);
    uVar9 = (undefined4)((ulong)base_ext_pubkey >> 0x20);
    CVar10 = (CfdError)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
    if (bVar2) {
      online_pubkey_bytes._4_4_ = local_4ac;
      online_pubkey_bytes._3_1_ = 1;
      goto LAB_004bd1c1;
    }
    local_4ac = local_4ac + 1;
  } while( true );
}

Assistant:

PegoutKeyData ConfidentialTransaction::GetPegoutPubkeyData(
    const Pubkey &online_pubkey, const Privkey &master_online_key,
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &whitelist, NetType net_type, const ByteData &pubkey_prefix,
    NetType elements_net_type, Address *descriptor_derive_address) {
  static constexpr uint32_t kPegoutBip32CountMaximum = 1000000000;
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPubkeySize = Pubkey::kCompressedPubkeySize;
  static constexpr uint32_t kWhitelistSingleSize = kPubkeySize * 2;
  PegoutKeyData result;
  std::vector<ByteData> offline_keys;
  std::vector<ByteData> online_keys;
  std::vector<uint8_t> whitelist_bytes = whitelist.GetBytes();
  uint32_t whitelist_size = static_cast<uint32_t>(whitelist_bytes.size());

  if ((whitelist_size == 0) ||
      ((whitelist_size % kWhitelistSingleSize) != 0)) {
    throw CfdException(kCfdIllegalArgumentError, "whitelist length error.");
  }
  // parameter check
  if (bip32_counter > kPegoutBip32CountMaximum) {
    throw CfdException(kCfdIllegalArgumentError, "bip32_counter over error.");
  }
  if ((!online_pubkey.IsValid()) || (!master_online_key.IsValid()) ||
      (!master_online_key.GeneratePubkey().Equals(online_pubkey))) {
    throw CfdException(kCfdIllegalArgumentError, "Illegal online key error.");
  }

  // CreatePAKListFromExtensionSpace
  decltype(whitelist_bytes)::const_iterator ite = whitelist_bytes.begin();
  uint32_t whitelist_count = whitelist_size / kWhitelistSingleSize;
  if (whitelist_count > kWhitelistCountMaximum) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal whitelist maximum error.");
  }

  try {
    for (uint32_t index = 0; index < whitelist_count; ++index) {
      uint32_t offline_key_start = index * kWhitelistSingleSize;
      uint32_t offline_key_end = offline_key_start + kPubkeySize;
      uint32_t online_key_start = offline_key_start + kPubkeySize;
      uint32_t online_key_end = (index + 1) * kWhitelistSingleSize;
      Pubkey offline_key(std::vector<uint8_t>(
          ite + offline_key_start, ite + offline_key_end));
      offline_keys.push_back(offline_key.GetData());
      Pubkey online_key(
          std::vector<uint8_t>(ite + online_key_start, ite + online_key_end));
      online_keys.push_back(online_key.GetData());
    }
  } catch (const CfdException &except) {
    throw CfdException(
        kCfdIllegalArgumentError,
        "Illegal whitelist key. (" + std::string(except.what()) + ")");
  }

  ByteData prefix = pubkey_prefix;
  if ((net_type == NetType::kTestnet) || ((net_type == NetType::kRegtest))) {
    prefix = ByteData("043587cf");
  } else if (net_type == NetType::kMainnet) {
    prefix = ByteData("0488b21e");
  } else if (prefix.GetDataSize() != 4) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal prefix and nettype.");
  }

  // check descriptor
  ExtPubkey xpub;
  ExtPubkey child_xpub = GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, prefix, net_type, elements_net_type,
      &xpub, descriptor_derive_address);
  // FlatSigningProvider provider;
  // const auto descriptor = Parse(desc_str, provider);
  // if (!descriptor) desc_str = "pkh(" + xpub.GetBase58String() + "/0/*)";

  // check whitelist
  uint32_t whitelist_index = 0;
  bool is_find = false;
  const ByteData &online_pubkey_bytes = online_pubkey.GetData();
  for (uint32_t index = 0; index < online_keys.size(); ++index) {
    if (online_pubkey_bytes.Equals(online_keys[index])) {
      whitelist_index = index;
      is_find = true;
      break;
    }
  }
  if (!is_find) {
    warn(CFD_LOG_SOURCE, "online_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "online_pubkey not exists.");
  }

  Pubkey offline_pubkey = xpub.GetPubkey();
  ByteData offline_pubkey_negate =
      WallyUtil::NegatePubkey(offline_pubkey.GetData());
  if (!offline_keys[whitelist_index].Equals(offline_pubkey_negate)) {
    warn(CFD_LOG_SOURCE, "offline_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "offline_pubkey not exists.");
  }

  // calc tweak
  ByteData256 tweak_sum = child_xpub.GetPubTweakSum();
  ByteData btcpubkeybytes =
      WallyUtil::AddTweakPubkey(offline_pubkey.GetData(), tweak_sum);

  ByteData whitelist_proof = WallyUtil::SignWhitelist(
      btcpubkeybytes, ByteData256(master_online_key.GetData().GetBytes()),
      tweak_sum, online_keys, offline_keys, whitelist_index);

  result.btc_pubkey_bytes = Pubkey(btcpubkeybytes);
  result.whitelist_proof = whitelist_proof;
  return result;
}